

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorRK64.cpp
# Opt level: O1

int __thiscall
pele::physics::reactions::ReactorRK64::react
          (ReactorRK64 *this,Real *rY_in,Real *rYsrc_in,Real *rX_in,Real *rX_src_in,Real *dt_react,
          Real *time,int ncells)

{
  int iVar1;
  int *piVar2;
  Real *__dest;
  Real *__src;
  Real *__dest_00;
  Real *__dest_01;
  pointer piVar3;
  pointer __dest_02;
  ulong uVar4;
  size_type a_size;
  int iVar5;
  size_type sVar6;
  DeviceVector<amrex::Real> rY;
  DeviceVector<int> v_nsteps;
  DeviceVector<amrex::Real> rX_src;
  DeviceVector<amrex::Real> rX;
  DeviceVector<amrex::Real> rYsrc;
  allocator_type local_271;
  Real *local_270;
  size_type local_268;
  Real *local_260;
  Real *local_258;
  Real *local_250;
  Real *local_248;
  Real *local_240;
  Real *local_238;
  size_type local_230;
  Real *local_228;
  Real *local_220;
  undefined8 local_218;
  undefined8 uStack_210;
  Real local_208;
  double local_200;
  undefined4 local_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  PODVector<double,_std::allocator<double>_> local_1c0;
  PODVector<int,_std::allocator<int>_> local_1a8;
  PODVector<double,_std::allocator<double>_> local_190;
  PODVector<double,_std::allocator<double>_> local_178;
  PODVector<double,_std::allocator<double>_> local_160;
  anon_class_280_15_fd04d24b local_148;
  
  a_size = (size_type)ncells;
  local_248 = (Real *)*time;
  local_200 = *dt_react + (double)local_248;
  local_268 = (size_type)(ncells * 0x16);
  local_148.time_init = 0.0;
  local_270 = dt_react;
  local_260 = rY_in;
  local_258 = rX_src_in;
  local_238 = rX_in;
  local_220 = rYsrc_in;
  local_218 = this;
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (&local_1c0,local_268,&local_148.time_init,(allocator_type *)&local_1f4);
  sVar6 = (size_type)(ncells * 0x15);
  local_148.time_init = 0.0;
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (&local_160,sVar6,&local_148.time_init,(allocator_type *)&local_1f4);
  local_148.time_init = 0.0;
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (&local_178,a_size,&local_148.time_init,(allocator_type *)&local_1f4);
  local_148.time_init = 0.0;
  amrex::PODVector<double,_std::allocator<double>_>::PODVector
            (&local_190,a_size,&local_148.time_init,(allocator_type *)&local_1f4);
  local_240 = local_160.m_data;
  local_228 = local_178.m_data;
  __dest_02 = local_190.m_data;
  local_250 = local_1c0.m_data;
  if (a_size != 0) {
    memcpy(local_1c0.m_data,local_260,local_268 * 8);
    memcpy(local_240,local_220,sVar6 * 8);
    memcpy(local_228,local_238,a_size * 8);
    memcpy(__dest_02,local_258,a_size * 8);
  }
  iVar5 = local_218->m_reactor_type;
  iVar1 = local_218->rk64_nsubsteps_guess;
  local_208 = local_218->absTol;
  local_1d0 = 0x20c4d527;
  uStack_1cc = 0x3ff3ec38;
  uStack_1c8 = 0x8268816c;
  uStack_1c4 = 0x3fda6434;
  uStack_1e0 = 0x668fef0a;
  uStack_1dc = 0x3fe0e07b;
  uStack_1d8 = 0x8225473a;
  uStack_1d4 = 0x3fa8d336;
  uStack_1f0 = 0x970776b5;
  uStack_1ec = 0x3fcbec5d;
  uStack_1e8 = 0x3226659c;
  uStack_1e4 = 0x3fd06dd0;
  local_148.time_init = (Real)((ulong)local_148.time_init & 0xffffffff00000000);
  piVar2 = &local_218->rk64_nsubsteps_max;
  local_218._0_4_ = local_218->rk64_nsubsteps_min;
  local_218._4_4_ = *piVar2;
  uStack_210 = 0;
  local_230 = sVar6;
  amrex::PODVector<int,_std::allocator<int>_>::PODVector
            (&local_1a8,a_size,(value_type_conflict *)&local_148,&local_271);
  piVar3 = local_1a8.m_data;
  sVar6 = local_230;
  local_148.time_init = (Real)local_248;
  local_148.d_rY = local_250;
  local_148.dt_react = *local_270;
  local_148.captured_nsubsteps_min = (int)local_218;
  local_148.captured_nsubsteps_max = local_218._4_4_;
  local_148.d_rX = local_228;
  local_248 = __dest_02;
  local_148.d_rX_src = __dest_02;
  local_148.d_rYsrc = local_240;
  local_148.time_out = local_200;
  local_148.rkp.nstages_rk64 = 6;
  local_148.rkp.alpha_rk64[0]._0_4_ = uStack_1f0;
  local_148.rkp._4_4_ = local_1f4;
  local_148.rkp.alpha_rk64[1]._0_4_ = uStack_1e8;
  local_148.rkp.alpha_rk64[0]._4_4_ = uStack_1ec;
  local_148.rkp.alpha_rk64[2]._0_4_ = uStack_1e0;
  local_148.rkp.alpha_rk64[1]._4_4_ = uStack_1e4;
  local_148.rkp.alpha_rk64[3]._0_4_ = uStack_1d8;
  local_148.rkp.alpha_rk64[2]._4_4_ = uStack_1dc;
  local_148.rkp.alpha_rk64[4]._0_4_ = local_1d0;
  local_148.rkp.alpha_rk64[3]._4_4_ = uStack_1d4;
  local_148.rkp.alpha_rk64[5]._0_4_ = uStack_1c8;
  local_148.rkp.alpha_rk64[4]._4_4_ = uStack_1cc;
  local_148.rkp.alpha_rk64[5]._4_4_ = uStack_1c4;
  local_148.rkp.beta_rk64[0] = -0.113554138044166;
  local_148.rkp.beta_rk64[1] = -0.2151185878184;
  local_148.rkp.beta_rk64[2] = -0.0510152146250577;
  local_148.rkp.beta_rk64[3] = -1.07992686223881;
  local_148.rkp.beta_rk64[4] = -0.248664241213447;
  local_148.rkp.beta_rk64[5] = 0.0;
  local_148.rkp.err_rk64[4] = 0.164022338959433;
  local_148.rkp.err_rk64[5] = 0.0426421977505659;
  local_148.rkp.err_rk64[2] = -0.0905918835751907;
  local_148.rkp.err_rk64[3] = -0.219084567203338;
  local_148.rkp.err_rk64[0] = -0.0554699315064507;
  local_148.rkp.err_rk64[1] = 0.15848184557498;
  local_148.rkp.exp1_rk64 = 0.25;
  local_148.rkp.exp2_rk64 = 0.2;
  local_148.rkp.betaerr_rk64 = 1.0;
  local_148.tinyval = 1e-50;
  local_148.captured_abstol = local_208;
  local_148.d_nsteps = local_1a8.m_data;
  local_148.captured_nsubsteps_guess = iVar1;
  local_148.captured_reactor_type = iVar5;
  if (ncells < 1) {
    local_270 = (Real *)0x0;
  }
  else {
    iVar5 = 0;
    do {
      react::anon_class_280_15_fd04d24b::operator()(&local_148,iVar5);
      iVar5 = iVar5 + 1;
    } while (ncells != iVar5);
    if (ncells < 1) {
      local_270 = (Real *)0x0;
    }
    else {
      uVar4 = 0;
      iVar5 = 0;
      do {
        iVar5 = iVar5 + piVar3[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)ncells != uVar4);
      local_270 = (Real *)(double)iVar5;
    }
  }
  __dest_01 = local_220;
  __dest_00 = local_238;
  __src = local_240;
  __dest = local_258;
  if (ncells != 0) {
    memcpy(local_260,local_250,local_268 << 3);
    memcpy(__dest_01,__src,sVar6 << 3);
    memcpy(__dest_00,local_228,a_size << 3);
    memcpy(__dest,local_248,a_size << 3);
  }
  if (local_1a8.m_data != (int *)0x0) {
    operator_delete(local_1a8.m_data,local_1a8.m_capacity << 2);
  }
  if (local_190.m_data != (Real *)0x0) {
    operator_delete(local_190.m_data,local_190.m_capacity << 3);
  }
  if (local_178.m_data != (Real *)0x0) {
    operator_delete(local_178.m_data,local_178.m_capacity << 3);
  }
  if (local_160.m_data != (Real *)0x0) {
    operator_delete(local_160.m_data,local_160.m_capacity << 3);
  }
  if (local_1c0.m_data != (Real *)0x0) {
    operator_delete(local_1c0.m_data,local_1c0.m_capacity << 3);
  }
  return (int)((double)local_270 / (double)ncells);
}

Assistant:

int
ReactorRK64::react(
  amrex::Real* rY_in,
  amrex::Real* rYsrc_in,
  amrex::Real* rX_in,
  amrex::Real* rX_src_in,
  amrex::Real& dt_react,
  amrex::Real& time,
  int ncells
#ifdef AMREX_USE_GPU
  ,
  amrex::gpuStream_t /*stream*/
#endif
)
{
  BL_PROFILE("Pele::ReactorRK64::react()");

  amrex::Real time_init = time;
  amrex::Real time_out = time + dt_react;
  const amrex::Real tinyval = 1e-50;

  // Copy to device
  amrex::Gpu::DeviceVector<amrex::Real> rY(ncells * (NUM_SPECIES + 1), 0);
  amrex::Gpu::DeviceVector<amrex::Real> rYsrc(ncells * NUM_SPECIES, 0);
  amrex::Gpu::DeviceVector<amrex::Real> rX(ncells, 0);
  amrex::Gpu::DeviceVector<amrex::Real> rX_src(ncells, 0);
  amrex::Real* d_rY = rY.data();
  amrex::Real* d_rYsrc = rYsrc.data();
  amrex::Real* d_rX = rX.data();
  amrex::Real* d_rX_src = rX_src.data();
  amrex::Gpu::copy(
    amrex::Gpu::hostToDevice, rY_in, rY_in + ncells * (NUM_SPECIES + 1), d_rY);
  amrex::Gpu::copy(
    amrex::Gpu::hostToDevice, rYsrc_in, rYsrc_in + ncells * NUM_SPECIES,
    d_rYsrc);
  amrex::Gpu::copy(amrex::Gpu::hostToDevice, rX_in, rX_in + ncells, d_rX);
  amrex::Gpu::copy(
    amrex::Gpu::hostToDevice, rX_src_in, rX_src_in + ncells, d_rX_src);

  // capture reactor type
  const int captured_reactor_type = m_reactor_type;
  const int captured_nsubsteps_guess = rk64_nsubsteps_guess;
  const int captured_nsubsteps_min = rk64_nsubsteps_min;
  const int captured_nsubsteps_max = rk64_nsubsteps_max;
  const amrex::Real captured_abstol = absTol;
  RK64Params rkp;

  amrex::Gpu::DeviceVector<int> v_nsteps(ncells, 0);
  int* d_nsteps = v_nsteps.data();

  amrex::ParallelFor(ncells, [=] AMREX_GPU_DEVICE(int icell) noexcept {
    amrex::Real soln_reg[NUM_SPECIES + 1] = {0.0};
    amrex::Real carryover_reg[NUM_SPECIES + 1] = {0.0};
    amrex::Real error_reg[NUM_SPECIES + 1] = {0.0};
    amrex::Real rhs[NUM_SPECIES + 1] = {0.0};
    amrex::Real rYsrc_ext[NUM_SPECIES] = {0.0};
    amrex::Real current_time = time_init;
    const int neq = (NUM_SPECIES + 1);

    for (int sp = 0; sp < neq; sp++) {
      soln_reg[sp] = d_rY[icell * neq + sp];
      carryover_reg[sp] = soln_reg[sp];
    }

    amrex::Real dt_rk = dt_react / amrex::Real(captured_nsubsteps_guess);
    amrex::Real dt_rk_min = dt_react / amrex::Real(captured_nsubsteps_max);
    amrex::Real dt_rk_max = dt_react / amrex::Real(captured_nsubsteps_min);

    amrex::Real rhoe_init[] = {d_rX[icell]};
    amrex::Real rhoesrc_ext[] = {d_rX_src[icell]};

    for (int sp = 0; sp < NUM_SPECIES; sp++) {
      rYsrc_ext[sp] = d_rYsrc[icell * NUM_SPECIES + sp];
    }

    int nsteps = 0;
    amrex::Real change_factor;
    while (current_time < time_out) {
      for (amrex::Real& sp : error_reg) {
        sp = 0.0;
      }
      for (int stage = 0; stage < rkp.nstages_rk64; stage++) {
        utils::fKernelSpec<Ordering>(
          0, 1, current_time - time_init, captured_reactor_type, soln_reg, rhs,
          rhoe_init, rhoesrc_ext, rYsrc_ext);

        for (int sp = 0; sp < neq; sp++) {
          error_reg[sp] += rkp.err_rk64[stage] * dt_rk * rhs[sp];
          soln_reg[sp] =
            carryover_reg[sp] + rkp.alpha_rk64[stage] * dt_rk * rhs[sp];
          carryover_reg[sp] =
            soln_reg[sp] + rkp.beta_rk64[stage] * dt_rk * rhs[sp];
        }
      }

      current_time += dt_rk;
      nsteps++;

      amrex::Real max_err = tinyval;
      for (amrex::Real sp : error_reg) {
        max_err = fabs(sp) > max_err ? fabs(sp) : max_err;
      }

      if (max_err < captured_abstol) {
        change_factor =
          rkp.betaerr_rk64 * pow((captured_abstol / max_err), rkp.exp1_rk64);
        dt_rk = amrex::min<amrex::Real>(dt_rk_max, dt_rk * change_factor);
      } else {
        change_factor =
          rkp.betaerr_rk64 * pow((captured_abstol / max_err), rkp.exp2_rk64);
        dt_rk = amrex::max<amrex::Real>(dt_rk_min, dt_rk * change_factor);
      }
    }
    // Don't overstep the integration time
    dt_rk = amrex::min<amrex::Real>(dt_rk, time_out - current_time);
    d_nsteps[icell] = nsteps;
    // copy data back
    for (int sp = 0; sp < neq; sp++) {
      d_rY[icell * neq + sp] = soln_reg[sp];
    }
    d_rX[icell] = rhoe_init[0] + dt_react * rhoesrc_ext[0];
  });

#ifdef MOD_REACTOR
  time = time_out;
#endif

  const int avgsteps = amrex::Reduce::Sum<int>(
    ncells, [=] AMREX_GPU_DEVICE(int i) noexcept -> int { return d_nsteps[i]; },
    0);

  amrex::Gpu::copy(
    amrex::Gpu::deviceToHost, d_rY, d_rY + ncells * (NUM_SPECIES + 1), rY_in);
  amrex::Gpu::copy(
    amrex::Gpu::deviceToHost, d_rYsrc, d_rYsrc + ncells * NUM_SPECIES,
    rYsrc_in);
  amrex::Gpu::copy(amrex::Gpu::deviceToHost, d_rX, d_rX + ncells, rX_in);
  amrex::Gpu::copy(
    amrex::Gpu::deviceToHost, d_rX_src, d_rX_src + ncells, rX_src_in);

  return (int(avgsteps / amrex::Real(ncells)));
}